

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O2

int skipToGenCode(char *dstName,FILE *out,FILE *templateFile)

{
  int iVar1;
  char *pcVar2;
  char *__format;
  
  __format = "Line with string %%%%%%GENCODE%%%%%% Missing in [%s]";
  do {
    pcVar2 = fgets(gTempBuf,16000,(FILE *)templateFile);
    if (pcVar2 == (char *)0x0) goto LAB_0011662b;
    iVar1 = bcmp(gTempBuf,"%%%GENCODE%%%",0xd);
    if (iVar1 == 0) {
      return 0;
    }
  } while ((out == (FILE *)0x0) || (iVar1 = fputs(gTempBuf,(FILE *)out), iVar1 != -1));
  __format = "Cannot write to [%s]\n";
LAB_0011662b:
  printf(__format,dstName);
  return -1;
}

Assistant:

static int skipToGenCode( const char *dstName, FILE *out, FILE *templateFile )
{
   unsigned int headerWritten = 0;

   while( fgets( gTempBuf, BUFFER_SIZE, templateFile ) )
   {
      if( strncmp( gTempBuf, "%%%GENCODE%%%", 13 ) == 0 )
      {
         headerWritten = 1;
         break;
      }
      if( out && (fputs( gTempBuf, out ) == EOF) )
      {
         printf( "Cannot write to [%s]\n", dstName );
         return -1;
      }
   }

   if( !headerWritten )
   {
      printf( "Line with string %%%%%%GENCODE%%%%%% Missing in [%s]", dstName );
      return -1;
   }

   return 0;
}